

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

bool cmCMakePresetsGraphInternal::PresetOptionalBoolHelper
               (optional<bool> *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  cmJSONState *local_28;
  Value *local_20;
  
  if (PresetOptionalBoolHelper(std::optional<bool>&,Json::Value_const*,cmJSONState*)::helper == '\0'
     ) {
    PresetOptionalBoolHelper();
  }
  local_28 = state;
  local_20 = value;
  if (PresetOptionalBoolHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*PresetOptionalBoolHelper::helper._M_invoker)
                      ((_Any_data *)&PresetOptionalBoolHelper::helper,out,&local_20,&local_28);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool PresetOptionalBoolHelper(cm::optional<bool>& out,
                              const Json::Value* value, cmJSONState* state)
{
  static auto const helper =
    JSONHelperBuilder::Optional<bool>(PresetBoolHelper);
  return helper(out, value, state);
}